

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Pixmap.cxx
# Opt level: O2

void __thiscall Fl_Pixmap::desaturate(Fl_Pixmap *this)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  char **ppcVar5;
  char *pcVar6;
  long lVar7;
  ulong uVar8;
  char *p;
  char *pcVar9;
  uint uVar10;
  uchar b;
  uchar r;
  int ncolors;
  int chars_per_pixel;
  char line [255];
  byte local_153;
  byte local_152;
  byte local_151;
  int local_150;
  int local_14c;
  Fl_Pixmap *local_148;
  long local_140;
  char local_138 [264];
  
  (*(this->super_Fl_Image)._vptr_Fl_Image[8])();
  copy_data(this);
  __isoc99_sscanf(*(this->super_Fl_Image).data_,"%*d%*d%d%d",&local_150,&local_14c);
  if (local_150 < 0) {
    pcVar9 = (this->super_Fl_Image).data_[1];
    for (lVar7 = 0; (int)lVar7 < -local_150; lVar7 = lVar7 + 1) {
      cVar1 = (char)(((uint)(byte)pcVar9[lVar7 * 4 + 2] * 0x3d +
                      (uint)(byte)pcVar9[lVar7 * 4 + 1] * 0x1f +
                     (uint)(byte)pcVar9[lVar7 * 4 + 3] * 8) / 100);
      pcVar9[lVar7 * 4 + 3] = cVar1;
      pcVar9[lVar7 * 4 + 2] = cVar1;
      pcVar9[lVar7 * 4 + 1] = cVar1;
    }
  }
  else {
    lVar7 = 0;
    local_148 = this;
LAB_001b125b:
    if (lVar7 < local_150) {
      local_140 = lVar7 + 1;
      pcVar6 = (this->super_Fl_Image).data_[lVar7 + 1] + (long)local_14c + 1;
      pcVar9 = pcVar6;
      p = pcVar6;
LAB_001b128a:
      while( true ) {
        pcVar9 = pcVar9 + 1;
        cVar1 = *pcVar6;
        if ((cVar1 == '\0') || (iVar2 = isspace((int)cVar1), iVar2 == 0)) break;
        pcVar6 = pcVar6 + 1;
      }
      do {
        pcVar6 = pcVar9;
        uVar10 = (uint)*pcVar6;
        if (uVar10 == 0) break;
        iVar2 = isspace(uVar10);
        pcVar9 = pcVar6 + 1;
      } while (iVar2 == 0);
      do {
        if ((char)uVar10 == '\0') goto LAB_001b130f;
        iVar2 = isspace((int)(char)uVar10);
        if (iVar2 == 0) goto code_r0x001b12e0;
        uVar10 = (uint)(byte)pcVar6[1];
        pcVar6 = pcVar6 + 1;
      } while( true );
    }
  }
  return;
code_r0x001b12e0:
  p = pcVar6;
  if (cVar1 == 'c') goto LAB_001b130f;
  while ((pcVar9 = pcVar6, (char)uVar10 != '\0' && (iVar2 = isspace((int)(char)uVar10), iVar2 == 0))
        ) {
    uVar10 = (uint)(byte)pcVar6[1];
    pcVar6 = pcVar6 + 1;
  }
  goto LAB_001b128a;
LAB_001b130f:
  iVar2 = fl_parse_color(p,&local_151,&local_153,&local_152);
  lVar7 = local_140;
  this = local_148;
  if (iVar2 != 0) {
    uVar10 = ((uint)local_153 * 0x3d + (uint)local_151 * 0x1f + (uint)local_152 * 8) / 100;
    local_153 = (byte)uVar10;
    pcVar9 = (local_148->super_Fl_Image).data_[local_140];
    uVar8 = (ulong)(ushort)uVar10;
    if (local_14c < 2) {
      pcVar6 = "%c c #%02X%02X%02X";
      uVar4 = uVar8;
    }
    else {
      pcVar6 = "%c%c c #%02X%02X%02X";
      uVar4 = (ulong)(uint)(int)pcVar9[1];
    }
    sprintf(local_138,pcVar6,(ulong)(uint)(int)*pcVar9,uVar4,uVar8,uVar8);
    ppcVar5 = (this->super_Fl_Image).data_;
    if (ppcVar5[lVar7] != (char *)0x0) {
      operator_delete__(ppcVar5[lVar7]);
      ppcVar5 = (this->super_Fl_Image).data_;
    }
    sVar3 = strlen(local_138);
    pcVar9 = (char *)operator_new__(sVar3 + 1);
    ppcVar5[lVar7] = pcVar9;
    strcpy((this->super_Fl_Image).data_[lVar7],local_138);
  }
  goto LAB_001b125b;
}

Assistant:

void Fl_Pixmap::desaturate() {
  // Delete any existing pixmap/mask objects...
  uncache();

  // Allocate memory as needed...
  copy_data();

  // Update the colormap to grayscale...
  char		line[255];	// New colormap line
  int		i,		// Looping var
		ncolors,	// Number of colors in image
		chars_per_pixel;// Characters per color
  uchar		r, g, b;

  sscanf(data()[0],"%*d%*d%d%d", &ncolors, &chars_per_pixel);

  if (ncolors < 0) {
    // Update FLTK colormap...
    ncolors = -ncolors;
    uchar *cmap = (uchar *)(data()[1]);
    for (i = 0; i < ncolors; i ++, cmap += 4) {
      g = (uchar)((cmap[1] * 31 + cmap[2] * 61 + cmap[3] * 8) / 100);
      cmap[1] = cmap[2] = cmap[3] = g;
    }
  } else {
    // Update standard XPM colormap...
    for (i = 0; i < ncolors; i ++) {
      // look for "c word", or last word if none:
      const char *p = data()[i + 1] + chars_per_pixel + 1;
      const char *previous_word = p;
      for (;;) {
	while (*p && isspace(*p)) p++;
	char what = *p++;
	while (*p && !isspace(*p)) p++;
	while (*p && isspace(*p)) p++;
	if (!*p) {p = previous_word; break;}
	if (what == 'c') break;
	previous_word = p;
	while (*p && !isspace(*p)) p++;
      }

      if (fl_parse_color(p, r, g, b)) {
        g = (uchar)((r * 31 + g * 61 + b * 8) / 100);

        if (chars_per_pixel > 1) sprintf(line, "%c%c c #%02X%02X%02X", data()[i + 1][0],
	                                 data()[i + 1][1], g, g, g);
        else sprintf(line, "%c c #%02X%02X%02X", data()[i + 1][0], g, g, g);

        delete[] (char *)data()[i + 1];
	((char **)data())[i + 1] = new char[strlen(line) + 1];
	strcpy((char *)data()[i + 1], line);
      }
    }
  }
}